

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::DoReserveMembers
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType newCapacity,
          CrtAllocator *allocator)

{
  Member *old_p;
  GenericMember<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar1;
  Member *newMembers;
  ObjectData *o;
  CrtAllocator *allocator_local;
  SizeType newCapacity_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if ((this->data_).s.hashcode < newCapacity) {
    old_p = GetMembersPointer(this);
    pGVar1 = Realloc<rapidjson::GenericMember<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                       (allocator,old_p,(ulong)(this->data_).s.hashcode,(ulong)newCapacity);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).s.str & 0xffff000000000000 | (ulong)pGVar1);
    (this->data_).s.hashcode = newCapacity;
  }
  return;
}

Assistant:

void DoReserveMembers(SizeType newCapacity, Allocator& allocator) {
        ObjectData& o = data_.o;
        if (newCapacity > o.capacity) {
            Member* newMembers = Realloc<Member>(allocator, GetMembersPointer(), o.capacity, newCapacity);
            RAPIDJSON_SETPOINTER(Member, o.members, newMembers);
            o.capacity = newCapacity;
        }
    }